

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O0

int menu_item_right_offset_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_30;
  Am_Object local_28;
  byte local_1d;
  Am_Widget_Look local_1c;
  bool menuBarItem;
  Am_Object *pAStack_18;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  pAStack_18 = self;
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_1c,in_value);
  local_1d = 0;
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)pAStack_18);
  Am_Object::Am_Object(&local_30,&Am_Menu_Bar);
  bVar1 = Am_Object::Is_Instance_Of(&local_28,&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  if (bVar1) {
    local_1d = 1;
  }
  if (local_1c.value == Am_MOTIF_LOOK_val) {
    self_local._4_4_ = 5;
  }
  else if (local_1c.value == Am_WINDOWS_LOOK_val) {
    self_local._4_4_ = 0x13;
    if ((local_1d & 1) != 0) {
      self_local._4_4_ = 5;
    }
  }
  else {
    if (local_1c.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    self_local._4_4_ = 6;
    if ((local_1d & 1) != 0) {
      self_local._4_4_ = 10;
    }
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, menu_item_right_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  bool menuBarItem = false;
  if (self.Get_Owner().Is_Instance_Of(Am_Menu_Bar))
    // is this item in the menu bar
    menuBarItem = true;

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return 5;

  case Am_WINDOWS_LOOK_val:
    return menuBarItem ? 5 : 19;

  case Am_MACINTOSH_LOOK_val:
    return menuBarItem ? 10 : 6;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 0; // we should never get here
}